

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

PropertiesIteratorView __thiscall Rml::Element::IterateLocalProperties(Element *this)

{
  long in_RSI;
  PropertiesIterator local_78;
  Element *this_local;
  
  this_local = this;
  ElementStyle::Iterate(&local_78,(ElementStyle *)(*(long *)(in_RSI + 0x180) + 0x38));
  MakeUnique<Rml::PropertiesIterator,Rml::PropertiesIterator>
            ((PropertiesIterator *)&stack0xffffffffffffffe0);
  PropertiesIteratorView::PropertiesIteratorView
            ((PropertiesIteratorView *)this,
             (UniquePtr<PropertiesIterator> *)&stack0xffffffffffffffe0);
  ::std::unique_ptr<Rml::PropertiesIterator,_std::default_delete<Rml::PropertiesIterator>_>::
  ~unique_ptr((unique_ptr<Rml::PropertiesIterator,_std::default_delete<Rml::PropertiesIterator>_> *)
              &stack0xffffffffffffffe0);
  return (UniquePtr<PropertiesIterator>)(UniquePtr<PropertiesIterator>)this;
}

Assistant:

PropertiesIteratorView Element::IterateLocalProperties() const
{
	return PropertiesIteratorView(MakeUnique<PropertiesIterator>(meta->style.Iterate()));
}